

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O0

void __thiscall
QEvdevKeyboardManager::QEvdevKeyboardManager
          (QEvdevKeyboardManager *this,QString *key,QString *specification,QObject *parent)

{
  bool bVar1;
  QDeviceDiscovery *slot;
  QObject *in_RCX;
  QString *in_RDX;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QString *device_1;
  QStringList *__range3;
  QDeviceDiscovery *deviceDiscovery;
  QString *device;
  add_const_t<QList<QString>_> *__range1;
  const_iterator __end3;
  const_iterator __begin3;
  QStringList devices;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedSpecification parsed;
  QString spec;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffe68;
  QDeviceType in_stack_fffffffffffffe6c;
  ParsedSpecification *in_stack_fffffffffffffe70;
  QObject *in_stack_fffffffffffffe80;
  QEvdevKeyboardManager *in_stack_fffffffffffffe88;
  QString *in_stack_fffffffffffffea8;
  ContextType *in_stack_fffffffffffffeb8;
  Object *sender;
  QObject *signal;
  undefined8 in_stack_fffffffffffffee8;
  QFlagsStorage<QDeviceDiscovery::QDeviceType> types;
  Connection local_108 [8];
  ConnectionType type;
  ParsedSpecification local_f0;
  QString *local_90;
  const_iterator local_88;
  const_iterator local_80;
  undefined1 local_78 [24];
  Object aOStack_60 [2];
  QString local_30;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  signal = in_RDI;
  QObject::QObject(in_RDI,in_RCX);
  *(undefined ***)in_RDI = &PTR_metaObject_001a87c8;
  QString::QString((QString *)0x132140);
  QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::DeviceHandlerList
            ((DeviceHandlerList<QEvdevKeyboardHandler> *)0x13214e);
  QString::QString((QString *)0x13215c);
  local_30.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_30.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_30.d.size = -0x5555555555555556;
  qEnvironmentVariable((char *)&local_30);
  bVar1 = QString::isEmpty((QString *)0x1321aa);
  if (bVar1) {
    QString::operator=(&local_30,in_RDX);
  }
  memset(local_78,0xaa,0x48);
  QEvdevUtil::parseSpecification(in_stack_fffffffffffffea8);
  QString::operator=(&in_stack_fffffffffffffe70->spec,
                     (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  sender = aOStack_60;
  local_80.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_80 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffe70);
  local_88.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_88 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffe70);
  while( true ) {
    local_90 = local_88.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_80,local_88);
    if (!bVar1) break;
    in_stack_fffffffffffffeb8 = (ContextType *)QList<QString>::const_iterator::operator*(&local_80);
    addKeyboard(in_stack_fffffffffffffe88,(QString *)in_stack_fffffffffffffe80);
    QList<QString>::const_iterator::operator++(&local_80);
  }
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x1322e1);
  if (bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevKey();
    anon_unknown.dwarf_e2e89::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe70,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      types.i = (Int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (!bVar1) break;
      anon_unknown.dwarf_e2e89::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x13233d);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffe80,(char *)in_RDI,
                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (char *)0x132356);
      QMessageLogger::debug((char *)&local_f0.args.d.size,"evdevkeyboard: Using device discovery");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    QFlags<QDeviceDiscovery::QDeviceType>::QFlags
              ((QFlags<QDeviceDiscovery::QDeviceType> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    slot = QDeviceDiscovery::create((QDeviceTypes)types.i,in_stack_fffffffffffffe80);
    if (slot != (QDeviceDiscovery *)0x0) {
      local_f0.devices.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_f0.devices.d.size = -0x5555555555555556;
      local_f0.args.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)slot + 0x60))(&local_f0.devices.d.ptr);
      local_f0.devices.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_f0.devices.d.d =
           (Data *)QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffe70);
      local_f0.spec.d.size = -0x5555555555555556;
      local_f0.spec.d.size =
           (qsizetype)QList<QString>::end((QList<QString> *)in_stack_fffffffffffffe70);
      while( true ) {
        local_f0.spec.d.ptr = (char16_t *)local_f0.spec.d.size;
        bVar1 = QList<QString>::const_iterator::operator!=
                          ((const_iterator *)&local_f0.devices,(const_iterator)local_f0.spec.d.size)
        ;
        if (!bVar1) break;
        QList<QString>::const_iterator::operator*((const_iterator *)&local_f0.devices);
        addKeyboard(in_stack_fffffffffffffe88,(QString *)in_stack_fffffffffffffe80);
        QList<QString>::const_iterator::operator++((const_iterator *)&local_f0.devices);
      }
      type = 0x1325e0;
      in_stack_fffffffffffffe70 = &local_f0;
      QObject::
      connect<void(QDeviceDiscovery::*)(QString_const&),void(QEvdevKeyboardManager::*)(QString_const&)>
                (sender,(offset_in_QDeviceDiscovery_to_subr)signal,in_stack_fffffffffffffeb8,
                 (offset_in_QEvdevKeyboardManager_to_subr *)slot,0x1325e0);
      QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffe70);
      QObject::
      connect<void(QDeviceDiscovery::*)(QString_const&),void(QEvdevKeyboardManager::*)(QString_const&)>
                (sender,(offset_in_QDeviceDiscovery_to_subr)signal,in_stack_fffffffffffffeb8,
                 (offset_in_QEvdevKeyboardManager_to_subr *)slot,type);
      QMetaObject::Connection::~Connection(local_108);
      QList<QString>::~QList((QList<QString> *)0x13259f);
    }
  }
  QEvdevUtil::ParsedSpecification::~ParsedSpecification(in_stack_fffffffffffffe70);
  QString::~QString((QString *)0x1325bb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEvdevKeyboardManager::QEvdevKeyboardManager(const QString &key, const QString &specification, QObject *parent)
    : QObject(parent)
{
    Q_UNUSED(key);


    QString spec = qEnvironmentVariable("QT_QPA_EVDEV_KEYBOARD_PARAMETERS");

    if (spec.isEmpty())
        spec = specification;

    auto parsed = QEvdevUtil::parseSpecification(spec);
    m_spec = std::move(parsed.spec);

    // add all keyboards for devices specified in the argument list
    for (const QString &device : std::as_const(parsed.devices))
        addKeyboard(device);

    if (parsed.devices.isEmpty()) {
        qCDebug(qLcEvdevKey, "evdevkeyboard: Using device discovery");
        if (auto deviceDiscovery = QDeviceDiscovery::create(QDeviceDiscovery::Device_Keyboard, this)) {
            // scan and add already connected keyboards
            const QStringList devices = deviceDiscovery->scanConnectedDevices();
            for (const QString &device : devices)
                addKeyboard(device);

            connect(deviceDiscovery, &QDeviceDiscovery::deviceDetected,
                    this, &QEvdevKeyboardManager::addKeyboard);
            connect(deviceDiscovery, &QDeviceDiscovery::deviceRemoved,
                    this, &QEvdevKeyboardManager::removeKeyboard);
        }
    }
}